

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureLevelHeightCase::checkTextureState
          (TextureLevelHeightCase *this,CallLogWrapper *gl,TextureGenerationSpec *spec)

{
  int level;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  int refValue_1;
  int queryLevel_1;
  int levelNdx;
  int refValue;
  int queryLevel;
  bool allOk;
  int initialValue;
  TextureGenerationSpec *spec_local;
  CallLogWrapper *gl_local;
  TextureLevelHeightCase *this_local;
  
  refValue._3_1_ = true;
  bVar1 = std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
          ::empty(&spec->levels);
  if (bVar1) {
    refValue._3_1_ =
         verifyTextureLevelParameterEqual
                   (gl,spec->queryTarget,0,0x1001,0,
                    (this->super_TextureLevelCommonCase).super_TextureLevelCase.m_type);
  }
  else {
    for (refValue_1 = 0;
        sVar2 = std::
                vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                ::size(&spec->levels), refValue_1 < (int)sVar2; refValue_1 = refValue_1 + 1) {
      pvVar3 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
               ::operator[](&spec->levels,(long)refValue_1);
      level = pvVar3->level;
      pvVar3 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
               ::operator[](&spec->levels,(long)refValue_1);
      bVar1 = verifyTextureLevelParameterEqual
                        (gl,spec->queryTarget,level,0x1001,pvVar3->height,
                         (this->super_TextureLevelCommonCase).super_TextureLevelCase.m_type);
      refValue._3_1_ = (refValue._3_1_ & bVar1) != 0;
    }
  }
  return refValue._3_1_;
}

Assistant:

bool checkTextureState (glu::CallLogWrapper& gl, const TextureGenerationSpec& spec)
	{
		const int	initialValue	= 0;
		bool		allOk			= true;

		if (spec.levels.empty())
		{
			const int queryLevel	= 0;
			const int refValue		= initialValue;

			allOk &= verifyTextureLevelParameterEqual(gl, spec.queryTarget, queryLevel, GL_TEXTURE_HEIGHT, refValue, m_type);
		}
		else
		{
			for (int levelNdx = 0; levelNdx < (int)spec.levels.size(); ++levelNdx)
			{
				const int queryLevel	= spec.levels[levelNdx].level;
				const int refValue		= spec.levels[levelNdx].height;

				allOk &= verifyTextureLevelParameterEqual(gl, spec.queryTarget, queryLevel, GL_TEXTURE_HEIGHT, refValue, m_type);
			}
		}

		return allOk;
	}